

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>,_20>::Resize
          (TPZManVector<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>,_20> *this,
          int64_t newsize)

{
  ulong uVar1;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *pTVar2;
  TPZReference *pTVar3;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *pTVar4;
  ulong *puVar5;
  undefined8 *puVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  
  if (-1 < newsize) {
    if ((this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNElements !=
        newsize) {
      lVar8 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNAlloc;
      if (lVar8 < newsize) {
        if (newsize < 0x15) {
          pTVar4 = this->fExtAlloc;
          if ((this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fStore !=
              pTVar4) {
            if (0 < (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).
                    fNElements) {
              lVar10 = 0;
              lVar8 = 0;
              do {
                TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::operator=
                          ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                           ((long)&pTVar4->fRef + lVar10),
                           (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                           ((long)&((this->
                                    super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>
                                    ).fStore)->fRef + lVar10));
                lVar8 = lVar8 + 1;
                lVar10 = lVar10 + 8;
              } while (lVar8 < (this->
                               super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).
                               fNElements);
            }
            pTVar2 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).
                     fStore;
            if (pTVar2 != (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)0x0) {
              pTVar3 = pTVar2[-1].fRef;
              if (pTVar3 != (TPZReference *)0x0) {
                lVar8 = (long)pTVar3 * 8;
                do {
                  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::~TPZAutoPointer
                            ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                             ((long)&pTVar2[-1].fRef + lVar8));
                  lVar8 = lVar8 + -8;
                } while (lVar8 != 0);
              }
              operator_delete__(pTVar2 + -1,(long)pTVar3 * 8 + 8);
            }
            (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fStore =
                 pTVar4;
          }
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNElements =
               newsize;
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNAlloc = 0;
        }
        else {
          dVar11 = (double)lVar8 * 1.2;
          uVar9 = (long)dVar11;
          if (dVar11 < (double)newsize) {
            uVar9 = newsize;
          }
          uVar1 = uVar9 * 8;
          uVar7 = 0xffffffffffffffff;
          if (uVar1 < 0xfffffffffffffff8) {
            uVar7 = uVar1 + 8;
          }
          puVar5 = (ulong *)operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar7);
          *puVar5 = uVar9;
          if (uVar9 != 0) {
            lVar8 = 0;
            do {
              puVar6 = (undefined8 *)operator_new(0x10);
              *puVar6 = 0;
              *(undefined4 *)(puVar6 + 1) = 0;
              LOCK();
              *(undefined4 *)(puVar6 + 1) = 1;
              UNLOCK();
              *(undefined8 **)((long)puVar5 + lVar8 + 8) = puVar6;
              lVar8 = lVar8 + 8;
            } while (uVar1 - lVar8 != 0);
          }
          if (0 < (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).
                  fNElements) {
            lVar8 = 0;
            lVar10 = 0;
            do {
              TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::operator=
                        ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                         ((long)&((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)(puVar5 + 1)
                                 )->fRef + lVar8),
                         (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                         ((long)&((this->
                                  super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>)
                                 .fStore)->fRef + lVar8));
              lVar10 = lVar10 + 1;
              lVar8 = lVar8 + 8;
            } while (lVar10 < (this->
                              super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).
                              fNElements);
          }
          pTVar4 = (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fStore;
          if (pTVar4 != (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)0x0 &&
              pTVar4 != this->fExtAlloc) {
            pTVar3 = pTVar4[-1].fRef;
            if (pTVar3 != (TPZReference *)0x0) {
              lVar8 = (long)pTVar3 * 8;
              do {
                TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::~TPZAutoPointer
                          ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                           ((long)&pTVar4[-1].fRef + lVar8));
                lVar8 = lVar8 + -8;
              } while (lVar8 != 0);
            }
            operator_delete__(pTVar4 + -1,(long)pTVar3 * 8 + 8);
          }
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fStore =
               (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)(puVar5 + 1);
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNElements =
               newsize;
          (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNAlloc = uVar9;
        }
      }
      else {
        (this->super_TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>).fNElements =
             newsize;
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}